

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.cxx
# Opt level: O1

void __thiscall cmInstallFilesCommand::FinalPass(cmInstallFilesCommand *this)

{
  string *regexp;
  size_type sVar1;
  long *plVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  string *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string testf;
  string local_108;
  string local_e8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string local_a0;
  string *local_80;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  if (this->IsFilesForm == false) {
    local_78 = &local_68;
    local_70 = 0;
    local_68 = '\0';
    regexp = (this->FinalArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->FinalArgs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)regexp) < 0x21) {
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity = 0;
      pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::string((string *)&local_108,pcVar4,(allocator *)&local_c0);
      cmSystemTools::Glob(&local_108,regexp,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if (local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        _Var9._M_p = local_e8._M_dataplus._M_p;
        do {
          FindInstallSource_abi_cxx11_(&local_108,this,*(char **)_Var9._M_p);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->Files,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          _Var9._M_p = _Var9._M_p + 0x20;
        } while (_Var9._M_p != (pointer)local_e8._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
    }
    else {
      filename = regexp + 1;
      local_80 = regexp;
      if (filename !=
          (this->FinalArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Files
        ;
        do {
          cmsys::SystemTools::GetFilenamePath(&local_108,filename);
          sVar1 = local_108._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (sVar1 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_e8,filename);
            plVar2 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e8,(ulong)(local_80->_M_dataplus)._M_p);
            psVar6 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_108.field_2._M_allocated_capacity = *psVar6;
              local_108.field_2._8_8_ = plVar2[3];
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            }
            else {
              local_108.field_2._M_allocated_capacity = *psVar6;
              local_108._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_108._M_string_length = plVar2[1];
            *plVar2 = (long)psVar6;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            uVar8 = local_e8.field_2._M_allocated_capacity;
            _Var9._M_p = local_e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_003516d9;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_50,filename);
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
            puVar5 = (ulong *)(plVar2 + 2);
            if ((ulong *)*plVar2 == puVar5) {
              local_b0 = *puVar5;
              lStack_a8 = plVar2[3];
              local_c0 = &local_b0;
            }
            else {
              local_b0 = *puVar5;
              local_c0 = (ulong *)*plVar2;
            }
            local_b8 = plVar2[1];
            *plVar2 = (long)puVar5;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_a0,filename);
            uVar7 = 0xf;
            if (local_c0 != &local_b0) {
              uVar7 = local_b0;
            }
            if (uVar7 < local_a0._M_string_length + local_b8) {
              uVar8 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                uVar8 = local_a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar8 < local_a0._M_string_length + local_b8) goto LAB_00351525;
              puVar3 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0)
              ;
            }
            else {
LAB_00351525:
              puVar3 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
            }
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            psVar6 = puVar3 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_e8.field_2._M_allocated_capacity = *psVar6;
              local_e8.field_2._8_8_ = puVar3[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *psVar6;
              local_e8._M_dataplus._M_p = (pointer)*puVar3;
            }
            local_e8._M_string_length = puVar3[1];
            *puVar3 = psVar6;
            puVar3[1] = 0;
            *(undefined1 *)psVar6 = 0;
            plVar2 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e8,(ulong)(local_80->_M_dataplus)._M_p);
            psVar6 = (size_type *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_108.field_2._M_allocated_capacity = *psVar6;
              local_108.field_2._8_8_ = plVar2[3];
              local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            }
            else {
              local_108.field_2._M_allocated_capacity = *psVar6;
              local_108._M_dataplus._M_p = (pointer)*plVar2;
            }
            local_108._M_string_length = plVar2[1];
            *plVar2 = (long)psVar6;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_78,(string *)&local_108);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            uVar8 = local_50.field_2._M_allocated_capacity;
            _Var9._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_003516d9:
              operator_delete(_Var9._M_p,uVar8 + 1);
            }
          }
          FindInstallSource_abi_cxx11_(&local_108,this,local_78);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_58,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          filename = filename + 1;
        } while (filename !=
                 (this->FinalArgs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    CreateInstallGenerator(this);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
  }
  return;
}

Assistant:

void cmInstallFilesCommand::FinalPass()
{
  // No final pass for "FILES" form of arguments.
  if (this->IsFilesForm) {
    return;
  }

  std::string testf;
  std::string const& ext = this->FinalArgs[0];

  // two different options
  if (this->FinalArgs.size() > 1) {
    // now put the files into the list
    std::vector<std::string>::iterator s = this->FinalArgs.begin();
    ++s;
    // for each argument, get the files
    for (; s != this->FinalArgs.end(); ++s) {
      // replace any variables
      std::string const& temps = *s;
      if (!cmSystemTools::GetFilenamePath(temps).empty()) {
        testf = cmSystemTools::GetFilenamePath(temps) + "/" +
          cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      } else {
        testf = cmSystemTools::GetFilenameWithoutLastExtension(temps) + ext;
      }

      // add to the result
      this->Files.push_back(this->FindInstallSource(testf.c_str()));
    }
  } else // reg exp list
  {
    std::vector<std::string> files;
    std::string const& regex = this->FinalArgs[0];
    cmSystemTools::Glob(this->Makefile->GetCurrentSourceDirectory(), regex,
                        files);

    std::vector<std::string>::iterator s = files.begin();
    // for each argument, get the files
    for (; s != files.end(); ++s) {
      this->Files.push_back(this->FindInstallSource(s->c_str()));
    }
  }

  this->CreateInstallGenerator();
}